

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool rfc4716_loadpub(BinarySource *src,char **algorithm,BinarySink *bs,char **commentptr,
                     char **errorstr)

{
  BinarySink *bs_00;
  int iVar1;
  uint32_t u;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  ptrlen pVar6;
  char *pcStack_b0;
  int n;
  char *p_1;
  char *q;
  char *p;
  int local_74;
  int alglen;
  int base64bytes;
  uchar base64out [3];
  strbuf *psStack_68;
  char base64in [4];
  strbuf *pubblob;
  char *comment;
  char *value;
  char *colon;
  char *line;
  char *error;
  char **errorstr_local;
  char **commentptr_local;
  BinarySink *bs_local;
  char **algorithm_local;
  BinarySource *src_local;
  
  pubblob = (strbuf *)0x0;
  psStack_68 = (strbuf *)0x0;
  pVar6 = BinarySource_get_chomped_line(src->binarysource_);
  colon = mkstr(pVar6);
  if ((colon == (char *)0x0) ||
     (iVar1 = strcmp(colon,"---- BEGIN SSH2 PUBLIC KEY ----"), iVar1 != 0)) {
    line = "invalid begin line in SSH-2 public key file";
  }
  else {
    safefree(colon);
    while( true ) {
      pVar6 = BinarySource_get_chomped_line(src->binarysource_);
      colon = mkstr(pVar6);
      if (colon == (char *)0x0) break;
      pcVar3 = strstr(colon,": ");
      if (pcVar3 == (char *)0x0) {
        psStack_68 = strbuf_new();
        local_74 = 0;
        while( true ) {
          bVar5 = false;
          if (colon != (char *)0x0) {
            bVar5 = *colon != '-';
          }
          if (!bVar5) break;
          for (pcStack_b0 = colon; *pcStack_b0 != '\0'; pcStack_b0 = pcStack_b0 + 1) {
            iVar1 = local_74 + 1;
            *(char *)((long)&base64bytes + (long)local_74) = *pcStack_b0;
            local_74 = iVar1;
            if (iVar1 == 4) {
              iVar1 = base64_decode_atom((char *)&base64bytes,(uchar *)((long)&alglen + 1));
              BinarySink_put_data(psStack_68->binarysink_,(void *)((long)&alglen + 1),(long)iVar1);
              local_74 = 0;
            }
          }
          safefree(colon);
          pVar6 = BinarySource_get_chomped_line(src->binarysource_);
          colon = mkstr(pVar6);
        }
        if ((colon == (char *)0x0) ||
           (iVar1 = strcmp(colon,"---- END SSH2 PUBLIC KEY ----"), iVar1 != 0)) {
          line = "invalid end line in SSH-2 public key file";
        }
        else {
          safefree(colon);
          colon = (char *)0x0;
          if (psStack_68->len < 4) {
            line = "not enough data in SSH-2 public key file";
          }
          else {
            u = GET_32BIT_MSB_FIRST(psStack_68->u);
            uVar2 = toint(u);
            if ((-1 < (int)uVar2) && ((ulong)(long)(int)uVar2 <= psStack_68->len - 4)) {
              if (algorithm != (char **)0x0) {
                pcVar3 = dupprintf("%.*s",(ulong)uVar2,psStack_68->s + 4);
                *algorithm = pcVar3;
              }
              if (commentptr == (char **)0x0) {
                safefree(pubblob);
              }
              else {
                *commentptr = (char *)pubblob;
              }
              bs_00 = bs->binarysink_;
              pVar6 = ptrlen_from_strbuf(psStack_68);
              BinarySink_put_datapl(bs_00,pVar6);
              strbuf_free(psStack_68);
              return true;
            }
            line = "invalid algorithm prefix in SSH-2 public key file";
          }
        }
        goto LAB_00133748;
      }
      *pcVar3 = '\0';
      q = pcVar3 + 2;
      iVar1 = strcmp(colon,"Comment");
      if (iVar1 == 0) {
        p_1 = colon;
        if ((*q == '\"') && (sVar4 = strlen(q), q[sVar4 - 1] == '\"')) {
          sVar4 = strlen(q);
          q[sVar4 - 1] = '\0';
          q = pcVar3 + 3;
        }
        for (; *q != '\0'; q = q + 1) {
          if ((*q == '\\') && (q[1] != '\0')) {
            q = q + 1;
          }
          *p_1 = *q;
          p_1 = p_1 + 1;
        }
        *p_1 = '\0';
        safefree(pubblob);
        pubblob = (strbuf *)dupstr(colon);
      }
      else {
        iVar1 = strcmp(colon,"Subject");
        if ((iVar1 != 0) && (iVar1 = strncmp(colon,"x-",2), iVar1 != 0)) {
          line = "unrecognised header in SSH-2 public key file";
          goto LAB_00133748;
        }
      }
      safefree(colon);
    }
    line = "truncated SSH-2 public key file";
  }
LAB_00133748:
  safefree(colon);
  safefree(pubblob);
  if (psStack_68 != (strbuf *)0x0) {
    strbuf_free(psStack_68);
  }
  if (errorstr != (char **)0x0) {
    *errorstr = line;
  }
  return false;
}

Assistant:

static bool rfc4716_loadpub(BinarySource *src, char **algorithm,
                            BinarySink *bs,
                            char **commentptr, const char **errorstr)
{
    const char *error;
    char *line, *colon, *value;
    char *comment = NULL;
    strbuf *pubblob = NULL;
    char base64in[4];
    unsigned char base64out[3];
    int base64bytes;
    int alglen;

    line = mkstr(get_chomped_line(src));
    if (!line || 0 != strcmp(line, "---- BEGIN SSH2 PUBLIC KEY ----")) {
        error = "invalid begin line in SSH-2 public key file";
        goto error;
    }
    sfree(line); line = NULL;

    while (1) {
        line = mkstr(get_chomped_line(src));
        if (!line) {
            error = "truncated SSH-2 public key file";
            goto error;
        }
        colon = strstr(line, ": ");
        if (!colon)
            break;
        *colon = '\0';
        value = colon + 2;

        if (!strcmp(line, "Comment")) {
            char *p, *q;

            /* Remove containing double quotes, if present */
            p = value;
            if (*p == '"' && p[strlen(p)-1] == '"') {
                p[strlen(p)-1] = '\0';
                p++;
            }

            /* Remove \-escaping, not in RFC4716 but seen in the wild
             * in practice. */
            for (q = line; *p; p++) {
                if (*p == '\\' && p[1])
                    p++;
                *q++ = *p;
            }

            *q = '\0';
            sfree(comment);   /* *just* in case of multiple Comment headers */
            comment = dupstr(line);
        } else if (!strcmp(line, "Subject") ||
                   !strncmp(line, "x-", 2)) {
            /* Headers we recognise and ignore. Do nothing. */
        } else {
            error = "unrecognised header in SSH-2 public key file";
            goto error;
        }

        sfree(line); line = NULL;
    }

    /*
     * Now line contains the initial line of base64 data. Loop round
     * while it still does contain base64.
     */
    pubblob = strbuf_new();
    base64bytes = 0;
    while (line && line[0] != '-') {
        char *p;
        for (p = line; *p; p++) {
            base64in[base64bytes++] = *p;
            if (base64bytes == 4) {
                int n = base64_decode_atom(base64in, base64out);
                put_data(pubblob, base64out, n);
                base64bytes = 0;
            }
        }
        sfree(line); line = NULL;
        line = mkstr(get_chomped_line(src));
    }

    /*
     * Finally, check the END line makes sense.
     */
    if (!line || 0 != strcmp(line, "---- END SSH2 PUBLIC KEY ----")) {
        error = "invalid end line in SSH-2 public key file";
        goto error;
    }
    sfree(line); line = NULL;

    /*
     * OK, we now have a public blob and optionally a comment. We must
     * return the key algorithm string too, so look for that at the
     * start of the public blob.
     */
    if (pubblob->len < 4) {
        error = "not enough data in SSH-2 public key file";
        goto error;
    }
    alglen = toint(GET_32BIT_MSB_FIRST(pubblob->u));
    if (alglen < 0 || alglen > pubblob->len-4) {
        error = "invalid algorithm prefix in SSH-2 public key file";
        goto error;
    }
    if (algorithm)
        *algorithm = dupprintf("%.*s", alglen, pubblob->s+4);
    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);
    put_datapl(bs, ptrlen_from_strbuf(pubblob));
    strbuf_free(pubblob);
    return true;

  error:
    sfree(line);
    sfree(comment);
    if (pubblob)
        strbuf_free(pubblob);
    if (errorstr)
        *errorstr = error;
    return false;
}